

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::internal::input
              (cvui_block_t *theBlock,int theX,int theY,int theWidth,String *theName,
              String *theContent,double theFontScale,bool theUpdateLayout)

{
  bool theFocused;
  int iVar1;
  int iVar2;
  int iVar3;
  Size local_58;
  Size aTextSize;
  Rect aRect;
  Size aContentSize;
  
  cv::getTextSize((string *)&aContentSize,(int)theContent,theFontScale,0,(int *)0x1);
  iVar3 = theWidth - (int)(theFontScale * 16.0);
  iVar2 = aContentSize.height + (aContentSize.height / 2) * 2 + 2;
  aRect.x = theX;
  aRect.y = theY;
  aRect.width = iVar3;
  aRect.height = iVar2;
  theFocused = inputUpdateFocus(theX,theY,theName,&aRect);
  iVar3 = iarea(theX,theY,iVar3,iVar2);
  iVar1 = inputUpdateCursor(theWidth,theContent,theFontScale,theFocused);
  iVar2 = gInput._44_4_ + 1;
  if (0x13 < (uint)gInput._44_4_) {
    iVar2 = 0;
  }
  gInput._44_4_ = iVar2;
  if (theUpdateLayout) {
    cv::getTextSize((string *)&aTextSize,(int)theContent,theFontScale,0,(int *)0x1);
    local_58 = aTextSize;
    updateLayoutFlow(theBlock,&local_58);
  }
  render::input(theBlock,&aRect,theContent,theFontScale,iVar3,theFocused);
  return iVar1;
}

Assistant:

int input(cvui_block_t& theBlock, int theX, int theY, int theWidth, const cv::String theName, cv::String& theContent, double theFontScale, bool theUpdateLayout) {
		cv::Size aContentSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
		int aPadding = aContentSize.height / 2;
        cv::Rect aRect(theX, theY, theWidth - render::getScreenCharWidth(theFontScale), aContentSize.height + 2 + aPadding * 2);

        bool aFocused = inputUpdateFocus(theX, theY, theName, aRect);
        int aInputAreaInteraction = cvui::iarea(theX, theY, aRect.width, aRect.height);        

        int key = inputUpdateCursor(theWidth, theContent, theFontScale, aFocused);
        inputUpdateCursorBlink();

		// Update the layout flow according to input size if we were told to update.
		if (theUpdateLayout) {
            cv::Size aTextSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
			cv::Size aSize(theWidth, aTextSize.height + aPadding * 2);
			updateLayoutFlow(theBlock, aTextSize);
		}

        render::input(theBlock, aRect, theContent, theFontScale, aInputAreaInteraction, aFocused);

        return key;
	}